

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_set.cc
# Opt level: O0

void __thiscall sfm::FeatureSet::compute_features(FeatureSet *this,Ptr *image)

{
  int iVar1;
  ImageBase *pIVar2;
  shared_ptr<const_core::Image<unsigned_char>_> local_48 [2];
  shared_ptr<const_core::Image<unsigned_char>_> local_28;
  Ptr *local_18;
  Ptr *image_local;
  FeatureSet *this_local;
  
  local_18 = image;
  image_local = (Ptr *)this;
  std::vector<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>::
  clear(&this->colors);
  std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::clear
            (&this->positions);
  pIVar2 = (ImageBase *)
           std::
           __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar1 = core::ImageBase::width(pIVar2);
  this->width = iVar1;
  pIVar2 = (ImageBase *)
           std::
           __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar1 = core::ImageBase::height(pIVar2);
  this->height = iVar1;
  if (((this->opts).feature_types & FEATURE_SIFT) != 0) {
    std::shared_ptr<core::Image<unsigned_char>const>::shared_ptr<core::Image<unsigned_char>,void>
              ((shared_ptr<core::Image<unsigned_char>const> *)&local_28,image);
    compute_sift(this,(ConstPtr *)&local_28);
    std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(&local_28);
  }
  if (((this->opts).feature_types & FEATURE_SURF) != 0) {
    std::shared_ptr<core::Image<unsigned_char>const>::shared_ptr<core::Image<unsigned_char>,void>
              ((shared_ptr<core::Image<unsigned_char>const> *)local_48,image);
    compute_surf(this,(ConstPtr *)local_48);
    std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(local_48);
  }
  return;
}

Assistant:

void
FeatureSet::compute_features (core::ByteImage::Ptr image)
{
    this->colors.clear();
    this->positions.clear();
    this->width = image->width();
    this->height = image->height();

    /* Make sure these are in the right order. Matching relies on it. */
    if (this->opts.feature_types & FEATURE_SIFT)
        this->compute_sift(image);
    if (this->opts.feature_types & FEATURE_SURF)
        this->compute_surf(image);
}